

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethpccal.cpp
# Opt level: O2

void icu_63::initializeSystemDefaultCentury(void)

{
  UDate millis;
  UErrorCode status;
  double local_388;
  Locale local_380;
  BuddhistCalendar calendar;
  
  status = U_ZERO_ERROR;
  Locale::Locale(&local_380,"@calendar=buddhist",(char *)0x0,(char *)0x0,(char *)0x0);
  BuddhistCalendar::BuddhistCalendar(&calendar,&local_380,&status);
  Locale::~Locale(&local_380);
  if (status < U_ILLEGAL_ARGUMENT_ERROR) {
    millis = Calendar::getNow();
    Calendar::setTimeInMillis((Calendar *)&calendar,millis,&status);
    Calendar::add((Calendar *)&calendar,UCAL_YEAR,-0x50,&status);
    local_388 = Calendar::getTimeInMillis((Calendar *)&calendar,&status);
    gSystemDefaultCenturyStartYear = Calendar::get((Calendar *)&calendar,UCAL_YEAR,&status);
    gSystemDefaultCenturyStart = local_388;
  }
  GregorianCalendar::~GregorianCalendar(&calendar.super_GregorianCalendar);
  return;
}

Assistant:

static void U_CALLCONV initializeSystemDefaultCentury()
{
    UErrorCode status = U_ZERO_ERROR;
    EthiopicCalendar calendar(Locale("@calendar=ethiopic"), status);
    if (U_SUCCESS(status)) {
        calendar.setTime(Calendar::getNow(), status);
        calendar.add(UCAL_YEAR, -80, status);

        gSystemDefaultCenturyStart = calendar.getTime(status);
        gSystemDefaultCenturyStartYear = calendar.get(UCAL_YEAR, status);
    }
    // We have no recourse upon failure unless we want to propagate the failure
    // out.
}